

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

int __thiscall bdQuery::addProxy(bdQuery *this,bdId *id,bdId *src,uint32_t srcmode)

{
  size_t *psVar1;
  list<bdPeer,_std::allocator<bdPeer>_> *plVar2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  _List_node_base *p_Var6;
  long lVar7;
  bdId *pbVar8;
  _List_node_base *p_Var9;
  undefined8 in_R8;
  undefined8 in_R9;
  byte bVar10;
  bdMetric dist;
  bdPeer peer;
  undefined1 local_8c [20];
  bdId local_78;
  uint32_t local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  
  bVar10 = 0;
  tVar5 = time((time_t *)0x0);
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&id->id,local_8c,in_R8,in_R9,tVar5);
  iVar3 = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,local_8c);
  iVar4 = 0;
  if ((src != (bdId *)0x0) && (iVar4 = 0, iVar3 == 0)) {
    iVar4 = updateProxyList(this,src,srcmode,&this->mProxiesUnknown);
    if (iVar4 == 0) {
      iVar3 = updateProxyList(this,src,srcmode,&this->mProxiesFlagged);
      iVar4 = 1;
      if (iVar3 == 0) {
        iVar4 = 0;
      }
    }
    if ((char)iVar4 == '\0') {
      bdId::bdId(&local_78);
      uStack_38 = 0;
      local_78.addr.sin_family = (src->addr).sin_family;
      local_78.addr.sin_port = (src->addr).sin_port;
      local_78.addr.sin_addr.s_addr = (src->addr).sin_addr.s_addr;
      local_78.addr.sin_zero = *&(src->addr).sin_zero;
      local_78.id.data._0_8_ = *(undefined8 *)(src->id).data;
      local_78.id.data._8_8_ = *(undefined8 *)((src->id).data + 8);
      local_78.id.data._16_4_ = *(undefined4 *)((src->id).data + 0x10);
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = (undefined4)tVar5;
      uStack_44 = (undefined4)((ulong)tVar5 >> 0x20);
      plVar2 = &this->mProxiesFlagged;
      if ((this->mRequiredPeerFlags & ~srcmode) != 0) {
        plVar2 = &this->mProxiesUnknown;
      }
      psVar1 = &(plVar2->super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node._M_size;
      local_54 = srcmode;
      uStack_40 = uStack_48;
      uStack_3c = uStack_44;
      p_Var6 = (_List_node_base *)operator_new(0x58);
      pbVar8 = &local_78;
      p_Var9 = p_Var6 + 1;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        p_Var9->_M_next = *(_List_node_base **)&pbVar8->addr;
        pbVar8 = (bdId *)((long)pbVar8 + (ulong)bVar10 * -0x10 + 8);
        p_Var9 = (_List_node_base *)&p_Var9[-(ulong)bVar10]._M_prev;
      }
      std::__detail::_List_node_base::_M_hook(p_Var6);
      *psVar1 = *psVar1 + 1;
    }
    trimProxies(this);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int bdQuery::addProxy(const bdId *id, const bdId *src, uint32_t srcmode) {
	bdMetric dist;
	time_t now = time(NULL);
	
	mFns->bdDistance(&mId, &(id->id), &dist);
	
	/* finally if it is an exact match, add as potential proxy */
	int bucket = mFns->bdBucketDistance(&dist);
	if ((bucket != 0) || (src == NULL))
		/* not a potential proxy */
		return 0;

#ifdef DEBUG_QUERY 
	fprintf(stderr, "Bucket = 0, Have Potential Proxy!\n");
#endif

	bool found = false;
	if (updateProxyList(src, srcmode, mProxiesUnknown))
		found = true;

	if (!found)
		if (updateProxyList(src, srcmode, mProxiesFlagged))
			found = true;

	if (!found) {
		/* if we get here. its not in the list */
#ifdef DEBUG_QUERY 
		fprintf(stderr, "Adding Source to Proxy List:\n");
#endif
		bdPeer peer;
		peer.mPeerId = *src;
		peer.mPeerFlags = srcmode;
		peer.mLastSendTime = 0;
		peer.mLastRecvTime = now;
		peer.mFoundTime = now;
	
		/* add it in */
		if ((srcmode & mRequiredPeerFlags) == mRequiredPeerFlags)
			mProxiesFlagged.push_front(peer);
		else
			mProxiesUnknown.push_front(peer);
	}

	trimProxies();
	
	return 1;
}